

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nxdn.cpp
# Opt level: O2

void __thiscall DSDcc::DSDNXDN::DSDNXDN(DSDNXDN *this,DSDDecoder *dsdDecoder)

{
  this->m_dsdDecoder = dsdDecoder;
  this->m_state = NXDNFrame;
  (this->m_lich).rfChannelCode = 0;
  (this->m_lich).fnChannelCode = 0;
  (this->m_lich).optionCode = 0;
  (this->m_lich).direction = 0;
  (this->m_lich).parity = 0;
  PN_9_5::PN_9_5(&this->m_pn,0xe4);
  this->m_inSync = false;
  this->m_lichEvenParity = 0;
  this->m_symbolIndex = 0;
  this->m_swallowCount = 0;
  CACOutbound::CACOutbound(&this->m_cac);
  CACShort::CACShort(&this->m_cacShort);
  CACLong::CACLong(&this->m_cacLong);
  SACCH::SACCH(&this->m_sacch);
  FACCH1::FACCH1(&this->m_facch1);
  UDCH::UDCH(&this->m_udch);
  this->m_lichBuffer[6] = '\0';
  this->m_lichBuffer[7] = '\0';
  this->m_syncBuffer[0] = '\0';
  this->m_syncBuffer[1] = '\0';
  this->m_syncBuffer[2] = '\0';
  this->m_syncBuffer[3] = '\0';
  this->m_syncBuffer[4] = '\0';
  this->m_syncBuffer[5] = '\0';
  this->m_syncBuffer[6] = '\0';
  this->m_syncBuffer[7] = '\0';
  *(undefined8 *)(this->m_syncBuffer + 8) = 0;
  this->w = (int *)0x0;
  this->x = (int *)0x0;
  this->y = (int *)0x0;
  this->z = (int *)0x0;
  this->m_rfChannel = NXDNRFCHUnknown;
  this->m_frameStructure = NXDNFSReserved;
  this->m_steal = NXDNStealReserved;
  this->m_ran = 0;
  this->m_idle = true;
  this->m_sourceId = 0;
  this->m_destinationId = 0;
  this->m_group = false;
  this->m_messageType = '\0';
  this->m_locationId = 0;
  this->m_services = 0;
  this->m_fullRate = false;
  this->m_rfChannelStr[0] = '\0';
  return;
}

Assistant:

DSDNXDN::DSDNXDN(DSDDecoder *dsdDecoder) :
		m_dsdDecoder(dsdDecoder),
		m_state(NXDNFrame),
		m_pn(0xe4), // TS 1A v0103 section 4.6
		m_inSync(false),
		m_lichEvenParity(0),
		m_symbolIndex(0),
		m_swallowCount(0),
        w(0),
        x(0),
        y(0),
        z(0)
{
    memset(m_syncBuffer, 0, 10);
    memset(m_lichBuffer, 0, 8);

    m_rfChannel = NXDNRFCHUnknown;
    m_frameStructure = NXDNFSReserved;
    m_steal = NXDNStealReserved;
    m_ran = 0;
    m_idle = true;
    m_sourceId = 0;
    m_destinationId = 0;
    m_group = false;
    m_messageType = 0;
    m_locationId = 0;
    m_services = 0;
    m_fullRate = false;

    m_rfChannelStr[0] = '\0';
}